

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellUtility.cpp
# Opt level: O3

string * __thiscall
llbuild::basic::shellEscaped_abi_cxx11_(string *__return_storage_ptr__,basic *this,StringRef string)

{
  size_t sVar1;
  StringRef string_00;
  SmallString<16U> out;
  raw_svector_ostream os;
  undefined1 *local_80;
  ulong local_78;
  undefined1 local_70 [16];
  raw_ostream local_60;
  undefined1 **local_38;
  
  sVar1 = string.Length;
  string_00.Data = string.Data;
  local_78 = 0x1000000000;
  local_60.BufferMode = InternalBuffer;
  local_60.OutBufStart = (char *)0x0;
  local_60.OutBufEnd = (char *)0x0;
  local_60.OutBufCur = (char *)0x0;
  local_60._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00251be0;
  local_38 = &local_80;
  local_80 = local_70;
  llvm::raw_ostream::SetUnbuffered(&local_60);
  string_00.Length = sVar1;
  appendShellEscapedString((basic *)&local_60,(raw_ostream *)this,string_00);
  if (local_80 == (undefined1 *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,local_80,local_80 + (local_78 & 0xffffffff));
  }
  llvm::raw_ostream::~raw_ostream(&local_60);
  if (local_80 != local_70) {
    free(local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string shellEscaped(StringRef string) {
  SmallString<16> out;
  llvm::raw_svector_ostream os(out);
  appendShellEscapedString(os, string);
  return out.str();
}